

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O3

int Aig_NodeMffcSupp(Aig_Man_t *p,Aig_Obj_t *pNode,int LevelMin,Vec_Ptr_t *vSupp)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  
  if (vSupp != (Vec_Ptr_t *)0x0) {
    vSupp->nSize = 0;
  }
  uVar1 = (uint)*(undefined8 *)&pNode->field_0x18;
  if ((uVar1 & 7) - 7 < 0xfffffffe) {
    iVar2 = 0;
    if ((uVar1 & 7) == 2 && vSupp != (Vec_Ptr_t *)0x0) {
      uVar1 = vSupp->nSize;
      if (uVar1 == vSupp->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vSupp->pArray,0x80);
          }
          vSupp->pArray = ppvVar4;
          vSupp->nCap = 0x10;
        }
        else {
          if (vSupp->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vSupp->pArray,(ulong)uVar1 << 4);
          }
          vSupp->pArray = ppvVar4;
          vSupp->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar4 = vSupp->pArray;
      }
      iVar2 = vSupp->nSize;
      vSupp->nSize = iVar2 + 1;
      ppvVar4[iVar2] = pNode;
      iVar2 = 0;
    }
  }
  else {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Aig_IsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigMffc.c"
                    ,0xbd,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    Aig_ManIncrementTravId(p);
    iVar2 = Aig_NodeDeref_rec(pNode,LevelMin,(float *)0x0,(float *)0x0);
    Aig_NodeMffcSupp_rec(p,pNode,LevelMin,vSupp,1,(Aig_Obj_t *)0x0);
    iVar3 = Aig_NodeRef_rec(pNode,LevelMin);
    if (iVar2 != iVar3) {
      __assert_fail("ConeSize1 == ConeSize2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigMffc.c"
                    ,0xc3,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
    if (iVar2 < 1) {
      __assert_fail("ConeSize1 > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigMffc.c"
                    ,0xc4,"int Aig_NodeMffcSupp(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *)");
    }
  }
  return iVar2;
}

Assistant:

int Aig_NodeMffcSupp( Aig_Man_t * p, Aig_Obj_t * pNode, int LevelMin, Vec_Ptr_t * vSupp )
{
    int ConeSize1, ConeSize2;
    if ( vSupp ) Vec_PtrClear( vSupp );
    if ( !Aig_ObjIsNode(pNode) )
    {
        if ( Aig_ObjIsCi(pNode) && vSupp )
            Vec_PtrPush( vSupp, pNode );
        return 0;
    }
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    ConeSize1 = Aig_NodeDeref_rec( pNode, LevelMin, NULL, NULL );
    Aig_NodeMffcSupp_rec( p, pNode, LevelMin, vSupp, 1, NULL );
    ConeSize2 = Aig_NodeRef_rec( pNode, LevelMin );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}